

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsPointerToArrayType(CopyPropagateArrays *this,uint32_t type_id)

{
  int iVar1;
  Kind KVar2;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar3;
  undefined4 extraout_var;
  bool local_31;
  Pointer *pointer_type;
  TypeManager *type_mgr;
  uint32_t type_id_local;
  CopyPropagateArrays *this_local;
  Pointer *this_02;
  
  this_00 = Pass::context((Pass *)this);
  this_01 = IRContext::get_type_mgr(this_00);
  pTVar3 = analysis::TypeManager::GetType(this_01,type_id);
  iVar1 = (*pTVar3->_vptr_Type[0x21])();
  this_02 = (Pointer *)CONCAT44(extraout_var,iVar1);
  if (this_02 == (Pointer *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pTVar3 = analysis::Pointer::pointee_type(this_02);
    KVar2 = analysis::Type::kind(pTVar3);
    local_31 = true;
    if (KVar2 != kArray) {
      pTVar3 = analysis::Pointer::pointee_type(this_02);
      KVar2 = analysis::Type::kind(pTVar3);
      local_31 = KVar2 == kImage;
    }
    this_local._7_1_ = local_31;
  }
  return this_local._7_1_;
}

Assistant:

bool CopyPropagateArrays::IsPointerToArrayType(uint32_t type_id) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Pointer* pointer_type = type_mgr->GetType(type_id)->AsPointer();
  if (pointer_type) {
    return pointer_type->pointee_type()->kind() == analysis::Type::kArray ||
           pointer_type->pointee_type()->kind() == analysis::Type::kImage;
  }
  return false;
}